

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_err_t * mpc_err_fail(mpc_input_t *i,char *failure)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 uVar4;
  mpc_err_t *pmVar5;
  size_t sVar6;
  char *pcVar7;
  
  if (i->suppress == 0) {
    pmVar5 = (mpc_err_t *)mpc_malloc(i,0x48);
    sVar6 = strlen(i->filename);
    pcVar7 = (char *)mpc_malloc(i,sVar6 + 1);
    pmVar5->filename = pcVar7;
    strcpy(pcVar7,i->filename);
    lVar1 = (i->state).row;
    lVar2 = (i->state).col;
    iVar3 = (i->state).term;
    uVar4 = *(undefined4 *)&(i->state).field_0x1c;
    (pmVar5->state).pos = (i->state).pos;
    (pmVar5->state).row = lVar1;
    (pmVar5->state).col = lVar2;
    (pmVar5->state).term = iVar3;
    *(undefined4 *)&(pmVar5->state).field_0x1c = uVar4;
    pmVar5->expected_num = 0;
    pmVar5->expected = (char **)0x0;
    sVar6 = strlen(failure);
    pcVar7 = (char *)mpc_malloc(i,sVar6 + 1);
    pmVar5->failure = pcVar7;
    strcpy(pcVar7,failure);
    pmVar5->received = ' ';
  }
  else {
    pmVar5 = (mpc_err_t *)0x0;
  }
  return pmVar5;
}

Assistant:

static mpc_err_t *mpc_err_fail(mpc_input_t *i, const char *failure) {
  mpc_err_t *x;
  if (i->suppress) { return NULL; }
  x = mpc_malloc(i, sizeof(mpc_err_t));
  x->filename = mpc_malloc(i, strlen(i->filename) + 1);
  strcpy(x->filename, i->filename);
  x->state = i->state;
  x->expected_num = 0;
  x->expected = NULL;
  x->failure = mpc_malloc(i, strlen(failure) + 1);
  strcpy(x->failure, failure);
  x->received = ' ';
  return x;
}